

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphml.hpp
# Opt level: O1

void __thiscall
bal::GraphMLWeightedStreamWriter::write_clauses(GraphMLWeightedStreamWriter *this,Cnf *value)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  uint uVar3;
  ulong uVar4;
  ostream *poVar5;
  _Rb_tree_node_base *p_Var6;
  uint uVar7;
  _Base_ptr p_Var8;
  _Rb_tree_header *p_Var9;
  ulong uVar10;
  ulong uVar11;
  uint *puVar12;
  uint uVar13;
  ulong uVar14;
  double dVar15;
  map<unsigned_long,_edge_data_t,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_edge_data_t>_>_>
  existing_edges;
  literal_t local_84;
  uint *local_80;
  pair<const_unsigned_long,_edge_data_t> local_78;
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_edge_data_t>,_std::_Select1st<std::pair<const_unsigned_long,_edge_data_t>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_edge_data_t>_>_>
  local_60;
  
  poVar5 = (this->super_GraphMLStreamWriter).super_StreamWriter<bal::Cnf>.stream_;
  *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) =
       *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) & 0xffffffb5 | 2;
  p_Var1 = &local_60._M_impl.super__Rb_tree_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  uVar10 = (ulong)(value->clauses_).size_;
  p_Var6 = &p_Var1->_M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  if (uVar10 != 0) {
    puVar12 = (value->clauses_).data_;
    local_80 = puVar12 + uVar10;
    do {
      uVar7 = *puVar12;
      uVar10 = (ulong)(uVar7 & 0xffff);
      if ((uVar7 & 0xffff) != 0) {
        uVar14 = 1;
        uVar11 = 0;
        do {
          uVar3 = (uint)uVar10;
          if (1 < uVar3) {
            uVar13 = 1;
            if (uVar3 < 4) {
              uVar13 = (uint)(ushort)(*(short *)(&DAT_00113d70 + (uVar7 >> 0x13 & 0x1e)) +
                                      *(short *)(&DAT_00113d70 + (uVar7 >> 0xf & 0x1e)) +
                                      *(short *)(&DAT_00113d70 + (uVar7 >> 0x17 & 0x1e)) +
                                     *(short *)(&DAT_00113d70 + (ulong)(uVar7 >> 0x1c) * 2));
            }
            if (uVar11 + 1 < (ulong)(ushort)*puVar12) {
              dVar15 = ((double)(uVar13 * 2) / (double)uVar3) / (double)(uVar3 - 1);
              uVar10 = uVar14;
              do {
                uVar4 = CONCAT44((puVar12[uVar10 + 1] >> 1) - 1,(puVar12[uVar11 + 1] >> 1) - 1);
                p_Var8 = &p_Var1->_M_header;
                for (p_Var2 = local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
                    (_Rb_tree_header *)p_Var2 != (_Rb_tree_header *)0x0;
                    p_Var2 = (&p_Var2->_M_left)[*(ulong *)(p_Var2 + 1) < uVar4]) {
                  if (*(ulong *)(p_Var2 + 1) >= uVar4) {
                    p_Var8 = p_Var2;
                  }
                }
                p_Var9 = p_Var1;
                if (((_Rb_tree_header *)p_Var8 != p_Var1) &&
                   (p_Var9 = (_Rb_tree_header *)p_Var8,
                   uVar4 < ((_Rb_tree_header *)p_Var8)->_M_node_count)) {
                  p_Var9 = p_Var1;
                }
                if (p_Var9 == p_Var1) {
                  local_78.first = uVar4;
                  local_78.second.cardinality = uVar13;
                  local_78.second.weight = dVar15;
                  std::
                  _Rb_tree<unsigned_long,std::pair<unsigned_long_const,bal::GraphMLWeightedStreamWriter::write_clauses(bal::Cnf_const&)::edge_data_t>,std::_Select1st<std::pair<unsigned_long_const,bal::GraphMLWeightedStreamWriter::write_clauses(bal::Cnf_const&)::edge_data_t>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,bal::GraphMLWeightedStreamWriter::write_clauses(bal::Cnf_const&)::edge_data_t>>>
                  ::
                  _M_insert_unique<std::pair<unsigned_long_const,bal::GraphMLWeightedStreamWriter::write_clauses(bal::Cnf_const&)::edge_data_t>>
                            ((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,bal::GraphMLWeightedStreamWriter::write_clauses(bal::Cnf_const&)::edge_data_t>,std::_Select1st<std::pair<unsigned_long_const,bal::GraphMLWeightedStreamWriter::write_clauses(bal::Cnf_const&)::edge_data_t>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,bal::GraphMLWeightedStreamWriter::write_clauses(bal::Cnf_const&)::edge_data_t>>>
                              *)&local_60,&local_78);
                }
                else {
                  *(uint *)(p_Var9 + 1) = *(int *)(p_Var9 + 1) + uVar13;
                  *(double *)((long)(p_Var9 + 1) + 8) = *(double *)((long)(p_Var9 + 1) + 8) + dVar15
                  ;
                }
                uVar10 = uVar10 + 1;
              } while (uVar10 < (ushort)*puVar12);
            }
          }
          uVar11 = uVar11 + 1;
          uVar7 = *puVar12;
          uVar10 = (ulong)(uVar7 & 0xffff);
          uVar14 = uVar14 + 1;
        } while (uVar11 < uVar10);
      }
      puVar12 = puVar12 + uVar10 + 1;
      p_Var6 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    } while (puVar12 < local_80);
  }
  while( true ) {
    if ((_Rb_tree_header *)p_Var6 == p_Var1) {
      std::
      _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_edge_data_t>,_std::_Select1st<std::pair<const_unsigned_long,_edge_data_t>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_edge_data_t>_>_>
      ::~_Rb_tree(&local_60);
      return;
    }
    uVar10 = *(ulong *)(p_Var6 + 1);
    p_Var2 = p_Var6[1]._M_left;
    poVar5 = (this->super_GraphMLStreamWriter).super_StreamWriter<bal::Cnf>.stream_;
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"<edge source=\"v",0xf);
    if (0x7ffffffe < (uint)uVar10) break;
    local_78.first = CONCAT44(local_78.first._4_4_,(uint)uVar10 * 2 + 3);
    poVar5 = operator<<(poVar5,(literal_t *)&local_78);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\" target=\"v",0xb);
    if (0x7ffffffe < (uint)(uVar10 >> 0x20)) break;
    local_84.id_ = (int)(uVar10 >> 0x1f) + 3;
    poVar5 = operator<<(poVar5,&local_84);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\">",2);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    poVar5 = (this->super_GraphMLStreamWriter).super_StreamWriter<bal::Cnf>.stream_;
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"<data key=\"e_cardinality\">",0x1a);
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"</data>",7);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((this->super_GraphMLStreamWriter).super_StreamWriter<bal::Cnf>.stream_,
               "<data key=\"e_weight\">",0x15);
    poVar5 = std::ostream::_M_insert<double>((double)p_Var2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"</data>",7);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    poVar5 = (this->super_GraphMLStreamWriter).super_StreamWriter<bal::Cnf>.stream_;
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"</edge>",7);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6);
  }
  __assert_fail("variableid <= VARIABLEID_MAX",
                "/workspace/llm4binary/github/license_all_cmakelists_25/vsklad[P]cgraph/bal/base/variables.hpp"
                ,0x11e,"bal::variable_t::variable_t(const variableid_t)");
}

Assistant:

virtual void write_clauses(const Cnf& value) override {
            typedef struct {
                unsigned cardinality;
                double weight;
            } edge_data_t;
            
            stream() << std::dec;
            std::map<uint64_t, edge_data_t> existing_edges;
            
            const uint32_t* data = value.data();
            const uint32_t* data_end = data + value.data_size();
            while (data < data_end) {
                // iterate literal pairs
                // it is guaranteed that the sequence is sorted and no duplicates exist
                // weight is calculated such that the sum of weights of edges generated from a clause is 1
                for (auto i = 0; i < _clause_size(data); i++) {
                    if (_clause_size(data) > 1) {
                        uint16_t cardinality = 1;
                        if (_clause_size(data) < 4) {
                            cardinality = get_cardinality_uint16(_clause_flags(data));
                        };
                        
                        const double weight = 2.0 * cardinality / _clause_size(data) / (_clause_size(data) - 1);
                        
                        for (auto j = i + 1; j < _clause_size(data); j++) {
                            const variableid_t source = literal_t__variable_id(_clause_literal(data, i));
                            const variableid_t target = literal_t__variable_id(_clause_literal(data, j));
                            const uint64_t key = ((uint64_t)target << 32) | source;
                            
                            // check if the adge exists already; ignore if so, add otherwise
                            auto it = existing_edges.find(key);
                            if (it == existing_edges.end()) {
                                const edge_data_t edge_data{cardinality, weight};
                                existing_edges.insert({key, edge_data});
                            } else {
                                it->second.cardinality += cardinality;
                                it->second.weight += weight;
                            };
                        };
                    };
                };
                
                data += _clause_memory_size(data);
            };
            
            for (auto edge: existing_edges) {
                const variableid_t source = edge.first & 0xFFFFFFFF;
                const variableid_t target = edge.first >> 32;
                
                stream() << "<edge source=\"v" << literal_t(variable_t(source)) << "\" target=\"v" << literal_t(variable_t(target)) << "\">" << std::endl;
                stream() << "<data key=\"e_cardinality\">" << edge.second.cardinality << "</data>" << std::endl;
                stream() << "<data key=\"e_weight\">" << edge.second.weight << "</data>" << std::endl;
                stream() << "</edge>" << std::endl;
            };
        }